

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utf.cpp
# Opt level: O0

void __thiscall
ShortJapaneseStringFixture_IndexCstr_Test::~ShortJapaneseStringFixture_IndexCstr_Test
          (ShortJapaneseStringFixture_IndexCstr_Test *this)

{
  ShortJapaneseStringFixture_IndexCstr_Test *this_local;
  
  ~ShortJapaneseStringFixture_IndexCstr_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F (ShortJapaneseStringFixture, IndexCstr) {
    char const * strz = str.c_str ();
    ASSERT_EQ (strz + 0, pstore::utf::index (strz, 0));
    ASSERT_EQ (strz + 3, pstore::utf::index (strz, 1));
    ASSERT_EQ (strz + 6, pstore::utf::index (strz, 2));
    ASSERT_EQ (strz + 9, pstore::utf::index (strz, 3));
    ASSERT_EQ (strz + 12, pstore::utf::index (strz, 4));
    ASSERT_EQ (strz + 15, pstore::utf::index (strz, 5));
    ASSERT_EQ (strz + 18, pstore::utf::index (strz, 6));
    ASSERT_EQ (strz + 21, pstore::utf::index (strz, 7));
    ASSERT_EQ (strz + 24, pstore::utf::index (strz, 8));
    ASSERT_EQ (static_cast<char const *> (nullptr), pstore::utf::index (strz, 9));
}